

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int JetHead::Socket::getHardwareAddress(char *if_name,char *out_addr)

{
  int __fd;
  byte bStack_5a;
  byte bStack_59;
  uchar MAC [14];
  int res;
  int sockfd;
  ifreq ifr;
  char *out_addr_local;
  char *if_name_local;
  
  ifr.ifr_ifru._16_8_ = out_addr;
  if ((if_name == (char *)0x0) || (out_addr == (char *)0x0)) {
    jh_log_print(2,"static int JetHead::Socket::getHardwareAddress(const char *, char *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x273,"NULL parameters supplied");
    if_name_local._4_4_ = -1;
  }
  else {
    __fd = socket(2,2,0);
    if (__fd < 0) {
      jh_log_print(1,"static int JetHead::Socket::getHardwareAddress(const char *, char *)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x27e,"socket failed");
      if_name_local._4_4_ = -1;
    }
    else {
      strncpy((char *)&res,if_name,0x10);
      ifr.ifr_ifrn.ifrn_name[7] = '\0';
      ifr.ifr_ifrn._8_2_ = 2;
      if_name_local._4_4_ = ioctl(__fd,0x8927,&res);
      if (if_name_local._4_4_ == 0) {
        bStack_5a = ifr.ifr_ifrn._14_1_;
        bStack_59 = ifr.ifr_ifrn._15_1_;
        sprintf((char *)ifr.ifr_ifru._16_8_,"%02X:%02X:%02X:%02X:%02X:%02X",ifr._10_8_ & 0xff,
                (ulong)ifr._10_8_ >> 8 & 0xff,(ulong)ifr._10_8_ >> 0x10 & 0xff,
                (ulong)ifr._10_8_ >> 0x18 & 0xff,(uint)bStack_5a,(uint)bStack_59);
        ::close(__fd);
      }
      else {
        jh_log_print(2,"static int JetHead::Socket::getHardwareAddress(const char *, char *)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                     ,0x28b,"failed to get hardware address");
        ::close(__fd);
      }
    }
  }
  return if_name_local._4_4_;
}

Assistant:

int Socket::getHardwareAddress(const char *if_name, char *out_addr)
{
#ifdef PLATFORM_DARWIN
	return 0;
#else
	if(not if_name or not out_addr)
	{
		LOG_WARN("NULL parameters supplied");
		return -1;
	}

	// open a socket
	struct ifreq ifr;
	int sockfd;
	
	sockfd = socket(PF_INET, SOCK_DGRAM, 0);
	if(sockfd < 0)
	{
		LOG_ERR_FATAL("socket failed");
		return -1;
	}

	strncpy(ifr.ifr_name, if_name, IFNAMSIZ);
	ifr.ifr_name[IFNAMSIZ -1] = 0;

	ifr.ifr_addr.sa_family = AF_INET;

	int res = ioctl(sockfd, SIOCGIFHWADDR, &ifr);

	if(res)
	{
		LOG_WARN("failed to get hardware address");
	
		::close(sockfd);
		
		return res;
	}

	// copy the hardware address into a temporary buffer (unsigned)
	unsigned char MAC[14];
	memcpy(MAC, &ifr.ifr_ifru.ifru_hwaddr.sa_data, 14);

	// print in MAC-address format
	sprintf(out_addr, "%02X:%02X:%02X:%02X:%02X:%02X",
				MAC[0], MAC[1], MAC[2], MAC[3], MAC[4], MAC[5]);

	::close(sockfd);

	return res;
#endif
}